

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void constant_time_conditional_memxor(void *dst,void *src,size_t n,crypto_word_t mask)

{
  int iVar1;
  crypto_word_t cVar2;
  ulong local_40;
  size_t i;
  uint8_t *in;
  uint8_t *out;
  crypto_word_t mask_local;
  size_t n_local;
  void *src_local;
  void *dst_local;
  
  iVar1 = buffers_alias(dst,n,src,n);
  if (iVar1 != 0) {
    __assert_fail("!buffers_alias(dst, n, src, n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/../internal.h"
                  ,0x1ab,
                  "void constant_time_conditional_memxor(void *, const void *, size_t, const crypto_word_t)"
                 );
  }
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    cVar2 = value_barrier_w(mask);
    *(byte *)((long)dst + local_40) =
         *(byte *)((long)dst + local_40) ^ (byte)cVar2 & *(byte *)((long)src + local_40);
  }
  return;
}

Assistant:

static inline void constant_time_conditional_memxor(void *dst, const void *src,
                                                    size_t n,
                                                    const crypto_word_t mask) {
  assert(!buffers_alias(dst, n, src, n));
  uint8_t *out = (uint8_t *)dst;
  const uint8_t *in = (const uint8_t *)src;
#if defined(__GNUC__) && !defined(__clang__)
  // gcc 13.2.0 doesn't automatically vectorize this loop regardless of barrier
  typedef uint8_t v32u8 __attribute__((vector_size(32), aligned(1), may_alias));
  size_t n_vec = n & ~(size_t)31;
  v32u8 masks = ((uint8_t)mask - (v32u8){});  // broadcast
  for (size_t i = 0; i < n_vec; i += 32) {
    *(v32u8 *)&out[i] ^= masks & *(v32u8 *)&in[i];
  }
  out += n_vec;
  n -= n_vec;
#endif
  for (size_t i = 0; i < n; i++) {
    out[i] ^= value_barrier_w(mask) & in[i];
  }
}